

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTopic.c
# Opt level: O0

sbfTopic sbfTopic_create(sbfTopicType type,char *string)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  sbfTopicType in_EDI;
  bool bVar3;
  char *cp;
  char *second;
  char *first;
  size_t size;
  sbfTopic topic;
  char *local_40;
  char *local_38;
  char *local_30;
  long local_28;
  sbfTopic local_20;
  char *local_18;
  sbfTopicType local_c;
  sbfTopic local_8;
  
  local_18 = in_RSI;
  local_c = in_EDI;
  sVar1 = strlen(in_RSI);
  local_28 = sVar1 + 1;
  local_20 = (sbfTopic)sbfMemory_calloc(1,0x28);
  local_20->mType = local_c;
  local_30 = (char *)sbfMemory_malloc(local_28);
  local_40 = local_30;
  while( true ) {
    bVar3 = false;
    if (*local_18 != '\0') {
      bVar3 = *local_18 != '/';
    }
    if (!bVar3) break;
    *local_40 = *local_18;
    local_40 = local_40 + 1;
    local_18 = local_18 + 1;
  }
  *local_40 = '\0';
  if (*local_18 == '\0') {
    pcVar2 = (char *)sbfMemory_strdup("");
    local_20->mFirst = pcVar2;
    pcVar2 = (char *)sbfMemory_strdup("");
    local_20->mSecond = pcVar2;
    local_20->mThird = local_30;
  }
  else {
    local_18 = local_18 + 1;
    local_38 = (char *)sbfMemory_malloc(local_28);
    local_40 = local_38;
    while( true ) {
      bVar3 = false;
      if (*local_18 != '\0') {
        bVar3 = *local_18 != '/';
      }
      if (!bVar3) break;
      *local_40 = *local_18;
      local_40 = local_40 + 1;
      local_18 = local_18 + 1;
    }
    *local_40 = '\0';
    if (*local_18 == '\0') {
      pcVar2 = (char *)sbfMemory_strdup("");
      local_20->mFirst = pcVar2;
      local_20->mSecond = local_30;
      local_20->mThird = local_38;
    }
    else {
      local_18 = local_18 + 1;
      local_20->mFirst = local_30;
      local_20->mSecond = local_38;
      pcVar2 = (char *)sbfMemory_strdup(local_18);
      local_20->mThird = pcVar2;
    }
  }
  sbfMemory_asprintf(&local_40,"%s/%s/%s",local_20->mFirst,local_20->mSecond,local_20->mThird);
  local_20->mTopic = local_40;
  sVar1 = strlen(local_20->mTopic);
  if (sVar1 < 0x100) {
    local_8 = local_20;
  }
  else {
    sbfTopic_destroy((sbfTopic)0x10b872);
    local_8 = (sbfTopic)0x0;
  }
  return local_8;
}

Assistant:

sbfTopic
sbfTopic_create (sbfTopicType type, const char* string)
{
    sbfTopic topic;
    size_t   size;
    char*    first;
    char*    second;
    char*    cp;

    size = strlen (string) + 1;

    topic = xcalloc (1, sizeof *topic);
    topic->mType = type;

    cp = first = xmalloc (size);
    while (*string != '\0' && *string != '/')
        *cp++ = *string++;
    *cp = '\0';
    if (*string == '\0')
    {
        topic->mFirst = xstrdup ("");
        topic->mSecond = xstrdup ("");
        topic->mThird = first;
        goto out;
    }
    string++;

    cp = second = xmalloc (size);
    while (*string != '\0' && *string != '/')
        *cp++ = *string++;
    *cp = '\0';
    if (*string == '\0')
    {
        topic->mFirst = xstrdup ("");
        topic->mSecond = first;
        topic->mThird = second;
        goto out;
    }
    string++;

    topic->mFirst = first;
    topic->mSecond = second;
    topic->mThird = xstrdup (string);

out:
    xasprintf (&cp, "%s/%s/%s", topic->mFirst, topic->mSecond, topic->mThird);
    topic->mTopic = cp;

    if (strlen (topic->mTopic) > SBF_TOPIC_SIZE_LIMIT)
    {
        sbfTopic_destroy (topic);
        return NULL;
    }
    return topic;
}